

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
clipp::usage_lines::group_surrounders_abi_cxx11_
          (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,usage_lines *this,group *group,context *cur)

{
  bool bVar1;
  size_type sVar2;
  child *pcVar3;
  ulong uVar4;
  string *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined4 local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  byte local_69;
  undefined1 local_68 [7];
  bool isOutermost;
  string postfix;
  string prefix;
  context *cur_local;
  group *group_local;
  usage_lines *this_local;
  
  std::__cxx11::string::string((string *)(postfix.field_2._M_local_buf + 8));
  std::__cxx11::string::string((string *)local_68);
  local_69 = group == cur->outermost;
  if (((bool)local_69) && ((this->ommitOutermostSurrounders_ & 1U) != 0)) {
    std::__cxx11::string::string((string *)&local_90);
    std::__cxx11::string::string((string *)&local_b0);
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    goto LAB_0012a89c;
  }
  bVar1 = clipp::group::exclusive(group);
  if (bVar1) {
    bVar1 = clipp::group::all_optional(group);
    if (bVar1) {
      psVar5 = doc_formatting::optional_prefix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5)
      ;
      psVar5 = doc_formatting::optional_postfix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
      bVar1 = clipp::group::all_flagless(group);
      if (bVar1) {
        psVar5 = doc_formatting::label_prefix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator+=
                  ((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5);
        psVar5 = doc_formatting::label_prefix_abi_cxx11_(&this->fmt_);
        std::operator+(&local_e0,psVar5,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68
                      );
        std::__cxx11::string::operator=((string *)local_68,(string *)&local_e0);
        std::__cxx11::string::~string((string *)&local_e0);
      }
    }
    else {
      bVar1 = clipp::group::all_flagless(group);
      if (bVar1) {
        psVar5 = doc_formatting::label_prefix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator=
                  ((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5);
        psVar5 = doc_formatting::label_postfix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
      }
      else {
        bVar1 = context::is_singleton(cur);
        if ((!bVar1) || ((local_69 & 1) == 0)) {
          psVar5 = doc_formatting::alternatives_prefix_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator=
                    ((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5);
          psVar5 = doc_formatting::alternatives_postfix_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
        }
      }
    }
  }
  else {
    sVar2 = clipp::group::size(group);
    if (1 < sVar2) {
      pcVar3 = clipp::group::front(group);
      bVar1 = clipp::group::child_t<clipp::parameter,_clipp::group>::blocking(pcVar3);
      if (bVar1) {
        pcVar3 = clipp::group::front(group);
        bVar1 = clipp::group::child_t<clipp::parameter,_clipp::group>::required(pcVar3);
        if (!bVar1) {
          psVar5 = doc_formatting::optional_prefix_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator=
                    ((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5);
          psVar5 = doc_formatting::optional_postfix_abi_cxx11_(&this->fmt_);
          std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
          goto LAB_0012a7ab;
        }
      }
    }
    sVar2 = clipp::group::size(group);
    if (((sVar2 < 2) || (bVar1 = context::is_alternative(cur), !bVar1)) || (group == cur->outermost)
       ) {
      bVar1 = clipp::group::exclusive(group);
      if (((!bVar1) && (bVar1 = clipp::group::joinable(group), bVar1)) &&
         ((cur->linestart & 1U) == 0)) {
        psVar5 = doc_formatting::joinable_prefix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator=
                  ((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5);
        psVar5 = doc_formatting::joinable_postfix_abi_cxx11_(&this->fmt_);
        std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
      }
    }
    else {
      psVar5 = doc_formatting::group_prefix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5)
      ;
      psVar5 = doc_formatting::group_postfix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
    }
  }
LAB_0012a7ab:
  bVar1 = detail::token<clipp::group>::repeatable(&group->super_token<clipp::group>);
  if (bVar1) {
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      psVar5 = doc_formatting::group_prefix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)(postfix.field_2._M_local_buf + 8),(string *)psVar5)
      ;
    }
    psVar5 = doc_formatting::repeat_prefix_abi_cxx11_(&this->fmt_);
    std::operator+(&local_100,psVar5,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   ((long)&postfix.field_2 + 8));
    std::__cxx11::string::operator=
              ((string *)(postfix.field_2._M_local_buf + 8),(string *)&local_100);
    std::__cxx11::string::~string((string *)&local_100);
    uVar4 = std::__cxx11::string::empty();
    if ((uVar4 & 1) != 0) {
      psVar5 = doc_formatting::group_postfix_abi_cxx11_(&this->fmt_);
      std::__cxx11::string::operator=((string *)local_68,(string *)psVar5);
    }
    psVar5 = doc_formatting::repeat_postfix_abi_cxx11_(&this->fmt_);
    std::__cxx11::string::operator+=((string *)local_68,(string *)psVar5);
  }
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
            (__return_storage_ptr__,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)&postfix.field_2 + 8),
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
LAB_0012a89c:
  local_c0 = 1;
  std::__cxx11::string::~string((string *)local_68);
  std::__cxx11::string::~string((string *)(postfix.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::pair<string,string>
    group_surrounders(const group& group, const context& cur) const
    {
        string prefix;
        string postfix;

        const bool isOutermost = &group == cur.outermost;
        if(isOutermost && ommitOutermostSurrounders_)
            return {string{}, string{}};

        if(group.exclusive()) {
            if(group.all_optional()) {
                prefix  = fmt_.optional_prefix();
                postfix = fmt_.optional_postfix();
                if(group.all_flagless()) {
                    prefix  += fmt_.label_prefix();
                    postfix = fmt_.label_prefix() + postfix;
                }
            } else if(group.all_flagless()) {
                prefix  = fmt_.label_prefix();
                postfix = fmt_.label_postfix();
            } else if(!cur.is_singleton() || !isOutermost) {
                prefix  = fmt_.alternatives_prefix();
                postfix = fmt_.alternatives_postfix();
            }
        }
        else if(group.size() > 1 &&
                group.front().blocking() && !group.front().required())
        {
            prefix  = fmt_.optional_prefix();
            postfix = fmt_.optional_postfix();
        }
        else if(group.size() > 1 && cur.is_alternative() &&
                &group != cur.outermost)
        {
            prefix  = fmt_.group_prefix();
            postfix = fmt_.group_postfix();
        }
        else if(!group.exclusive() &&
            group.joinable() && !cur.linestart)
        {
            prefix  = fmt_.joinable_prefix();
            postfix = fmt_.joinable_postfix();
        }

        if(group.repeatable()) {
            if(prefix.empty()) prefix = fmt_.group_prefix();
            prefix = fmt_.repeat_prefix() + prefix;
            if(postfix.empty()) postfix = fmt_.group_postfix();
            postfix += fmt_.repeat_postfix();
        }

        return {std::move(prefix), std::move(postfix)};
    }